

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

void __thiscall
lf::mesh::hybrid2d::anon_unknown_6::EndpointIndexPair::EndpointIndexPair
          (EndpointIndexPair *this,size_type p0,size_type p1)

{
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  size_type local_18;
  size_type local_14;
  size_type p1_local;
  size_type p0_local;
  EndpointIndexPair *this_local;
  
  this->p0_ = p0;
  this->p1_ = p1;
  if (p0 == p1) {
    local_18 = p1;
    local_14 = p0;
    _p1_local = this;
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"No loops allowed");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"p0 != p1",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x87,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
               ,&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
    lf::base::AssertionFailed(&local_240,&local_268,0x87,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    abort();
  }
  if (p0 < p1) {
    this->cmp_p0_ = p0;
    this->cmp_p1_ = p1;
  }
  else {
    this->cmp_p0_ = p1;
    this->cmp_p1_ = p0;
  }
  return;
}

Assistant:

EndpointIndexPair(size_type p0, size_type p1) : p0_(p0), p1_(p1) {
    LF_ASSERT_MSG(p0 != p1, "No loops allowed");
    if (p1 > p0) {
      cmp_p0_ = p0;
      cmp_p1_ = p1;
    } else {
      cmp_p0_ = p1;
      cmp_p1_ = p0;
    }
  }